

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName,string *aVersion)

{
  ArgumentParser *this_00;
  Argument *pAVar1;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *Fargs_1;
  string *in_stack_ffffffffffffff08;
  Argument *in_stack_ffffffffffffff10;
  int aNumArgs;
  Argument *this_03;
  ArgumentParser *in_stack_ffffffffffffff80;
  allocator<char> local_71;
  string local_70 [39];
  undefined1 local_49 [73];
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  this_01 = in_RDI + 0x20;
  std::__cxx11::string::string(this_01,in_RDX);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x40);
  std::__cxx11::string::string((string *)this_02);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)0x11f90f);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)0x11f925);
  Fargs_1 = in_RDI + 0xb0;
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
         *)0x11f93b);
  this_00 = (ArgumentParser *)
            add_argument<char_const*,char_const*>
                      (in_stack_ffffffffffffff80,(char *)in_RDI,(char *)Fargs_1);
  this_03 = (Argument *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)in_RDX);
  pAVar1 = Argument::help(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  aNumArgs = (int)((ulong)pAVar1 >> 0x20);
  Argument::nargs(this_03,aNumArgs);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  add_argument<char_const*,char_const*>(this_00,(char *)in_RDI,(char *)Fargs_1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)in_RDX);
  Argument::help(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Argument::nargs(this_03,aNumArgs);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {}, std::string aVersion = "1.0")
      : mProgramName(std::move(aProgramName)), mVersion(std::move(aVersion)) {
    add_argument("-h", "--help")
        .help("shows help message and exits")
        .nargs(0);
    add_argument("-v", "--version")
        .help("prints version information and exits")
        .nargs(0);
  }